

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_mul_2(mp_int *a,mp_int *b)

{
  int iVar1;
  mp_digit *pmVar2;
  mp_digit *pmVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar6 = a->used;
  if (b->alloc <= (int)uVar6) {
    iVar5 = mp_grow(b,uVar6 + 1);
    if (iVar5 != 0) {
      return iVar5;
    }
    uVar6 = a->used;
  }
  iVar5 = b->used;
  b->used = uVar6;
  pmVar2 = b->dp;
  iVar1 = a->used;
  if (0 < iVar1) {
    pmVar3 = a->dp;
    lVar7 = 0;
    uVar8 = 0;
    do {
      uVar4 = pmVar3[lVar7];
      uVar9 = uVar4 * 2 & 0xffffffffffffffe | uVar8;
      uVar8 = uVar4 >> 0x3b;
      pmVar2[lVar7] = uVar9;
      lVar7 = lVar7 + 1;
    } while (iVar1 != (int)lVar7);
    if (uVar4 >> 0x3b != 0) {
      pmVar2[lVar7] = 1;
      uVar6 = uVar6 + 1;
      b->used = uVar6;
    }
  }
  if ((int)uVar6 < iVar5) {
    memset(pmVar2 + (int)uVar6,0,(ulong)(iVar5 + ~uVar6) * 8 + 8);
  }
  b->sign = a->sign;
  return 0;
}

Assistant:

int mp_mul_2(mp_int * a, mp_int * b)
{
  int     x, res, oldused;

  /* grow to accomodate result */
  if (b->alloc < a->used + 1) {
    if ((res = mp_grow (b, a->used + 1)) != MP_OKAY) {
      return res;
    }
  }

  oldused = b->used;
  b->used = a->used;

  {
    register mp_digit r, rr, *tmpa, *tmpb;

    /* alias for source */
    tmpa = a->dp;
    
    /* alias for dest */
    tmpb = b->dp;

    /* carry */
    r = 0;
    for (x = 0; x < a->used; x++) {
    
      /* get what will be the *next* carry bit from the 
       * MSB of the current digit 
       */
      rr = *tmpa >> ((mp_digit)(DIGIT_BIT - 1));
      
      /* now shift up this digit, add in the carry [from the previous] */
      *tmpb++ = ((*tmpa++ << ((mp_digit)1)) | r) & MP_MASK;
      
      /* copy the carry that would be from the source 
       * digit into the next iteration 
       */
      r = rr;
    }

    /* new leading digit? */
    if (r != 0) {
      /* add a MSB which is always 1 at this point */
      *tmpb = 1;
      ++(b->used);
    }

    /* now zero any excess digits on the destination 
     * that we didn't write to 
     */
    tmpb = b->dp + b->used;
    for (x = b->used; x < oldused; x++) {
      *tmpb++ = 0;
    }
  }
  b->sign = a->sign;
  return MP_OKAY;
}